

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_manager.cpp
# Opt level: O2

bool __thiscall
miniros::ServiceManager::advertiseService(ServiceManager *this,AdvertiseServiceOptions *ops)

{
  pointer pcVar1;
  MasterLink *this_00;
  bool bVar2;
  uint32_t uVar3;
  string *psVar4;
  XmlRpcValue *pXVar5;
  allocator<char> local_489;
  XmlRpcValue args;
  string local_478;
  XmlRpcValue local_458;
  XmlRpcValue payload;
  XmlRpcValue result;
  char uri_buf [1024];
  
  std::recursive_mutex::lock(&this->shutting_down_mutex_);
  if ((this->shutting_down_ == false) &&
     ((this->master_link_).super___shared_ptr<miniros::MasterLink,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0)) {
    std::mutex::lock(&this->service_publications_mutex_);
    bVar2 = isServiceAdvertised(this,&ops->service);
    if (bVar2) {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (advertiseService::loc.initialized_ == false) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)uri_buf,"miniros.service_manager",(allocator<char> *)&local_478);
        console::initializeLogLocation(&advertiseService::loc,(string *)uri_buf,Error);
        std::__cxx11::string::~string((string *)uri_buf);
      }
      if (advertiseService::loc.level_ != Error) {
        console::setLogLocationLevel(&advertiseService::loc,Error);
        console::checkLogLocationEnabled(&advertiseService::loc);
      }
      if (advertiseService::loc.logger_enabled_ == true) {
        console::print((FilterBase *)0x0,advertiseService::loc.logger_,advertiseService::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/service_manager.cpp"
                       ,0x83,
                       "bool miniros::ServiceManager::advertiseService(const AdvertiseServiceOptions &)"
                       ,"Tried to advertise a service that is already advertised in this node [%s]",
                       (ops->service)._M_dataplus._M_p);
      }
    }
    else {
      std::
      make_shared<miniros::ServicePublication,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::shared_ptr<miniros::ServiceCallbackHelper>const&,miniros::CallbackQueueInterface*const&,std::shared_ptr<void_const>const&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uri_buf,
                 &ops->service,&ops->md5sum,&ops->datatype,&ops->req_datatype,
                 (shared_ptr<miniros::ServiceCallbackHelper> *)&ops->res_datatype,
                 (CallbackQueueInterface **)&ops->helper,
                 (shared_ptr<const_void> *)&ops->callback_queue);
      std::__cxx11::
      list<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
      ::push_back(&this->service_publications_,(value_type *)uri_buf);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(uri_buf + 8));
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->service_publications_mutex_);
    if (!bVar2) {
      args._type = TypeInvalid;
      args._value.asDouble = 0.0;
      result._type = TypeInvalid;
      result._value.asDouble = 0.0;
      payload._type = TypeInvalid;
      payload._value.asDouble = 0.0;
      psVar4 = this_node::getName_abi_cxx11_();
      XmlRpc::XmlRpcValue::XmlRpcValue((XmlRpcValue *)uri_buf,psVar4);
      pXVar5 = XmlRpc::XmlRpcValue::operator[](&args,0);
      XmlRpc::XmlRpcValue::operator=(pXVar5,(XmlRpcValue *)uri_buf);
      XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)uri_buf);
      XmlRpc::XmlRpcValue::XmlRpcValue((XmlRpcValue *)uri_buf,&ops->service);
      pXVar5 = XmlRpc::XmlRpcValue::operator[](&args,1);
      XmlRpc::XmlRpcValue::operator=(pXVar5,(XmlRpcValue *)uri_buf);
      XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)uri_buf);
      psVar4 = network::getHost_abi_cxx11_();
      pcVar1 = (psVar4->_M_dataplus)._M_p;
      uVar3 = ConnectionManager::getTCPPort
                        ((this->connection_manager_).
                         super___shared_ptr<miniros::ConnectionManager,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
      snprintf(uri_buf,0x400,"rosrpc://%s:%d",pcVar1,(ulong)uVar3);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_478,uri_buf,&local_489);
      XmlRpc::XmlRpcValue::XmlRpcValue(&local_458,&local_478);
      pXVar5 = XmlRpc::XmlRpcValue::operator[](&args,2);
      XmlRpc::XmlRpcValue::operator=(pXVar5,&local_458);
      XmlRpc::XmlRpcValue::~XmlRpcValue(&local_458);
      std::__cxx11::string::~string((string *)&local_478);
      XmlRpc::XmlRpcValue::XmlRpcValue
                ((XmlRpcValue *)&local_478,
                 &((this->xmlrpc_manager_).
                   super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->uri_
                );
      pXVar5 = XmlRpc::XmlRpcValue::operator[](&args,3);
      XmlRpc::XmlRpcValue::operator=(pXVar5,(XmlRpcValue *)&local_478);
      XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)&local_478);
      this_00 = (this->master_link_).
                super___shared_ptr<miniros::MasterLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_478,"registerService",(allocator<char> *)&local_458);
      MasterLink::execute(this_00,&local_478,&args,&result,&payload,true);
      std::__cxx11::string::~string((string *)&local_478);
      XmlRpc::XmlRpcValue::~XmlRpcValue(&payload);
      XmlRpc::XmlRpcValue::~XmlRpcValue(&result);
      XmlRpc::XmlRpcValue::~XmlRpcValue(&args);
      bVar2 = true;
      goto LAB_00246b2e;
    }
  }
  bVar2 = false;
LAB_00246b2e:
  pthread_mutex_unlock((pthread_mutex_t *)&this->shutting_down_mutex_);
  return bVar2;
}

Assistant:

bool ServiceManager::advertiseService(const AdvertiseServiceOptions& ops)
{
  std::scoped_lock<std::recursive_mutex> shutdown_lock(shutting_down_mutex_);
  if (shutting_down_ || !master_link_)
  {
    return false;
  }

  {
    std::scoped_lock<std::mutex> lock(service_publications_mutex_);

    if (isServiceAdvertised(ops.service))
    {
      MINIROS_ERROR("Tried to advertise a service that is already advertised in this node [%s]", ops.service.c_str());
      return false;
    }

    ServicePublicationPtr pub = std::make_shared<ServicePublication>(ops.service, ops.md5sum, ops.datatype,
      ops.req_datatype, ops.res_datatype, ops.helper, ops.callback_queue, ops.tracked_object);
    service_publications_.push_back(pub);
  }

  XmlRpcValue args, result, payload;
  args[0] = this_node::getName();
  args[1] = ops.service;
  char uri_buf[1024];
  std::snprintf(uri_buf, sizeof(uri_buf), "rosrpc://%s:%d",
           network::getHost().c_str(), connection_manager_->getTCPPort());
  args[2] = string(uri_buf);
  args[3] = xmlrpc_manager_->getServerURI();
  master_link_->execute("registerService", args, result, payload, true);

  return true;
}